

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkStrash.c
# Opt level: O0

void Nwk_ManStrashNode_rec(Aig_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *p1;
  Hop_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkStrash.c"
                  ,0x2f,"void Nwk_ManStrashNode_rec(Aig_Man_t *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 == 0)) {
    pHVar2 = Hop_ObjFanin0(pObj);
    Nwk_ManStrashNode_rec(p,pHVar2);
    pHVar2 = Hop_ObjFanin1(pObj);
    Nwk_ManStrashNode_rec(p,pHVar2);
    pAVar3 = (Aig_Obj_t *)Hop_ObjChild0Copy(pObj);
    p1 = (Aig_Obj_t *)Hop_ObjChild1Copy(pObj);
    pAVar3 = Aig_And(p,pAVar3,p1);
    (pObj->field_0).pData = pAVar3;
    iVar1 = Hop_ObjIsMarkA(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkStrash.c"
                    ,0x35,"void Nwk_ManStrashNode_rec(Aig_Man_t *, Hop_Obj_t *)");
    }
    Hop_ObjSetMarkA(pObj);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives AIG from the local functions of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Nwk_ManStrashNode_rec( Aig_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Nwk_ManStrashNode_rec( p, Hop_ObjFanin0(pObj) ); 
    Nwk_ManStrashNode_rec( p, Hop_ObjFanin1(pObj) );
    pObj->pData = Aig_And( p, (Aig_Obj_t *)Hop_ObjChild0Copy(pObj), (Aig_Obj_t *)Hop_ObjChild1Copy(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}